

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

int Gia_ManChoiceMinLevel_rec(Gia_Man_t *p,int iPivot,int fDiveIn,Vec_Int_t *vMap)

{
  uint *puVar1;
  Vec_Int_t *pVVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Gia_Obj_t *extraout_RDX;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *extraout_RDX_00;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  
  if ((iPivot < 0) || (p->nObjs <= iPivot)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar8 = p->pObjs;
  if ((~*(uint *)(pGVar8 + (uint)iPivot) & 0x9fffffff) == 0) {
    return 0;
  }
  if (iPivot < p->nObjs) {
    pVVar2 = p->vLevels;
    Vec_IntFillExtra(pVVar2,iPivot + 1,fDiveIn);
    if (pVVar2->nSize <= iPivot) {
LAB_001fdd34:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pGVar8 = pGVar8 + (uint)iPivot;
    if (pVVar2->pArray[(uint)iPivot] != 0) {
      pGVar3 = p->pObjs;
      if ((pGVar8 < pGVar3) || (pGVar3 + p->nObjs <= pGVar8)) goto LAB_001fdd15;
      iVar7 = (int)((long)pGVar8 - (long)pGVar3 >> 2);
      uVar5 = iVar7 * -0x55555555;
      pVVar2 = p->vLevels;
      Vec_IntFillExtra(pVVar2,uVar5 + 1,iVar7);
      if ((-1 < (int)uVar5) && ((int)uVar5 < pVVar2->nSize)) {
        return pVVar2->pArray[uVar5 & 0x7fffffff];
      }
      goto LAB_001fdd34;
    }
    if (fDiveIn != 0) {
      uVar9 = (ulong)(uint)p->pReprs[(uint)iPivot] & 0xfffffff;
      iVar7 = (int)uVar9;
      if (((uVar9 != 0xfffffff) && (iVar7 != 0)) || (0 < p->pNexts[(uint)iPivot])) {
        if (((~(uint)p->pReprs[uVar9] & 0xfffffff) != 0) || (p->pNexts[uVar9] < 1)) {
          __assert_fail("Gia_ObjIsHead(p, iRepr)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                        ,0x217,"int Gia_ManChoiceMinLevel_rec(Gia_Man_t *, int, int, Vec_Int_t *)");
        }
        if (iVar7 == 0) {
          iVar6 = 1000000000;
          iVar10 = -1;
        }
        else {
          uVar11 = 0xffffffff;
          iVar6 = 1000000000;
          uVar12 = uVar9;
          do {
            iVar4 = Gia_ManChoiceMinLevel_rec(p,(int)uVar12,0,vMap);
            if (iVar4 < iVar6) {
              uVar11 = uVar12;
            }
            iVar10 = (int)uVar11;
            if (iVar4 <= iVar6) {
              iVar6 = iVar4;
            }
            puVar1 = (uint *)(p->pNexts + uVar12);
            uVar12 = (ulong)*puVar1;
            pGVar8 = extraout_RDX;
          } while (0 < (int)*puVar1);
        }
        if (iVar6 < 1) {
          __assert_fail("LevMin > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                        ,0x220,"int Gia_ManChoiceMinLevel_rec(Gia_Man_t *, int, int, Vec_Int_t *)");
        }
        if (iVar7 < vMap->nSize) {
          vMap->pArray[uVar9] = iVar10;
          if (((~(uint)p->pReprs[uVar9] & 0xfffffff) != 0) || (p->pNexts[uVar9] < 1)) {
            __assert_fail("Gia_ObjIsHead(p, iRepr)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                          ,0x222,"int Gia_ManChoiceMinLevel_rec(Gia_Man_t *, int, int, Vec_Int_t *)"
                         );
          }
          if (iVar7 == 0) {
            return iVar6;
          }
          while( true ) {
            pVVar2 = p->vLevels;
            Vec_IntFillExtra(pVVar2,(int)uVar9 + 1,(int)pGVar8);
            if (pVVar2->nSize <= (int)uVar9) break;
            pVVar2->pArray[uVar9] = iVar6;
            puVar1 = (uint *)(p->pNexts + uVar9);
            uVar9 = (ulong)*puVar1;
            pGVar8 = extraout_RDX_00;
            if ((int)*puVar1 < 1) {
              return iVar6;
            }
          }
        }
        goto LAB_001fdcd7;
      }
    }
    uVar5 = (uint)*(undefined8 *)pGVar8;
    if (((int)uVar5 < 0) || ((uVar5 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pPivot)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                    ,0x226,"int Gia_ManChoiceMinLevel_rec(Gia_Man_t *, int, int, Vec_Int_t *)");
    }
    iVar6 = Gia_ManChoiceMinLevel_rec(p,iPivot - (uVar5 & 0x1fffffff),1,vMap);
    iVar7 = Gia_ManChoiceMinLevel_rec(p,iPivot - (*(uint *)&pGVar8->field_0x4 & 0x1fffffff),1,vMap);
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    pGVar3 = p->pObjs;
    if ((pGVar3 <= pGVar8) && (pGVar8 < pGVar3 + p->nObjs)) {
      iVar6 = (int)((long)pGVar8 - (long)pGVar3 >> 2);
      uVar5 = iVar6 * -0x55555555;
      pVVar2 = p->vLevels;
      Vec_IntFillExtra(pVVar2,uVar5 + 1,iVar6);
      if ((-1 < (int)uVar5) && ((int)uVar5 < pVVar2->nSize)) {
        pVVar2->pArray[uVar5 & 0x7fffffff] = iVar7 + 1;
        return iVar7 + 1;
      }
LAB_001fdcd7:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
  }
LAB_001fdd15:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Gia_ManChoiceMinLevel_rec( Gia_Man_t * p, int iPivot, int fDiveIn, Vec_Int_t * vMap )
{
    int Level0, Level1, LevelMax;
    Gia_Obj_t * pPivot = Gia_ManObj( p, iPivot );
    if ( Gia_ObjIsCi(pPivot) )
        return 0;
    if ( Gia_ObjLevel(p, pPivot) )
        return Gia_ObjLevel(p, pPivot);
    if ( fDiveIn && Gia_ObjIsClass(p, iPivot) )
    {
        int iObj, ObjMin = -1, iRepr = Gia_ObjRepr(p, iPivot), LevMin = ABC_INFINITY;
        Gia_ClassForEachObj( p, iRepr, iObj )
        {
            int LevCur = Gia_ManChoiceMinLevel_rec( p, iObj, 0, vMap );
            if ( LevMin > LevCur )
            {
                LevMin = LevCur;
                ObjMin = iObj;
            }
        }
        assert( LevMin > 0 );
        Vec_IntWriteEntry( vMap, iRepr, ObjMin );
        Gia_ClassForEachObj( p, iRepr, iObj )
            Gia_ObjSetLevelId( p, iObj, LevMin );
        return LevMin;
    }
    assert( Gia_ObjIsAnd(pPivot) );
    Level0 = Gia_ManChoiceMinLevel_rec( p, Gia_ObjFaninId0(pPivot, iPivot), 1, vMap );
    Level1 = Gia_ManChoiceMinLevel_rec( p, Gia_ObjFaninId1(pPivot, iPivot), 1, vMap );
    LevelMax = 1 + Abc_MaxInt(Level0, Level1);
    Gia_ObjSetLevel( p, pPivot, LevelMax );
    return LevelMax;
}